

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
::find_or_prepare_insert_non_soo<std::basic_string_view<char,std::char_traits<char>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
          *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined4 uVar18;
  bool bVar19;
  char cVar20;
  ushort uVar21;
  MixingHashState MVar22;
  ulong uVar23;
  ctrl_t *pcVar24;
  ulong uVar25;
  bool bVar26;
  anon_union_8_1_a8a14541_for_iterator_2 aVar27;
  uint uVar28;
  uint64_t v;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  FindInfo FVar35;
  __m128i match;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::pair<unsigned_long,_unsigned_long>_&>_>
  local_58;
  undefined1 local_48 [16];
  
  size = key->_M_len;
  MVar22 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,(uchar *)key->_M_str,
                      size);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = MVar22.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar30 = SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar3 = *(ulong *)(this + 0x10);
  uVar23 = (uVar30 >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar32 = ZEXT216(CONCAT11((char)uVar30,(char)uVar30) & 0x7f7f);
  auVar32 = pshuflw(auVar32,auVar32,0);
  local_48._0_4_ = auVar32._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  pcVar24 = (__return_storage_ptr__->first).ctrl_;
  aVar27 = (__return_storage_ptr__->first).field_1;
  bVar26 = __return_storage_ptr__->second;
  uVar29 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar23);
    local_a8 = *pcVar1;
    cStack_a7 = pcVar1[1];
    cStack_a6 = pcVar1[2];
    cStack_a5 = pcVar1[3];
    uVar18 = *(undefined4 *)pcVar1;
    cVar20 = pcVar1[4];
    cVar7 = pcVar1[5];
    cVar8 = pcVar1[6];
    cVar9 = pcVar1[7];
    cVar10 = pcVar1[8];
    cVar11 = pcVar1[9];
    cVar12 = pcVar1[10];
    cVar13 = pcVar1[0xb];
    cVar14 = pcVar1[0xc];
    cVar15 = pcVar1[0xd];
    cVar16 = pcVar1[0xe];
    cVar17 = pcVar1[0xf];
    auVar33[0] = -(local_48[0] == local_a8);
    auVar33[1] = -(local_48[1] == cStack_a7);
    auVar33[2] = -(local_48[2] == cStack_a6);
    auVar33[3] = -(local_48[3] == cStack_a5);
    auVar33[4] = -(local_48[4] == cVar20);
    auVar33[5] = -(local_48[5] == cVar7);
    auVar33[6] = -(local_48[6] == cVar8);
    auVar33[7] = -(local_48[7] == cVar9);
    auVar33[8] = -(local_48[8] == cVar10);
    auVar33[9] = -(local_48[9] == cVar11);
    auVar33[10] = -(local_48[10] == cVar12);
    auVar33[0xb] = -(local_48[0xb] == cVar13);
    auVar33[0xc] = -(local_48[0xc] == cVar14);
    auVar33[0xd] = -(local_48[0xd] == cVar15);
    auVar33[0xe] = -(local_48[0xe] == cVar16);
    auVar33[0xf] = -(local_48[0xf] == cVar17);
    uVar21 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    uVar28 = (uint)uVar21;
    while (uVar21 != 0) {
      uVar5 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar25 = uVar5 + uVar23 & uVar2;
      lVar31 = uVar25 * 0x30;
      local_58.second.super__Tuple_impl<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&>.
      super__Head_base<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&,_false>._M_head_impl =
           (_Tuple_impl<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&>)
           (*(long *)(this + 0x18) + lVar31 + 0x20);
      local_58.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + lVar31);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar19 = memory_internal::
               DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,std::__cxx11::string_const&,std::tuple<std::pair<unsigned_long,unsigned_long>const&>>
                         (&local_68,&local_58);
      if (bVar19) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar26;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar25);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar31 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_002b893a;
      }
      uVar21 = (ushort)(uVar28 - 1) & (ushort)uVar28;
      uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar21);
      local_a8 = (char)uVar18;
      cStack_a7 = (char)((uint)uVar18 >> 8);
      cStack_a6 = (char)((uint)uVar18 >> 0x10);
      cStack_a5 = (char)((uint)uVar18 >> 0x18);
    }
    auVar34[0] = -(local_a8 == -0x80);
    auVar34[1] = -(cStack_a7 == -0x80);
    auVar34[2] = -(cStack_a6 == -0x80);
    auVar34[3] = -(cStack_a5 == -0x80);
    auVar34[4] = -(cVar20 == -0x80);
    auVar34[5] = -(cVar7 == -0x80);
    auVar34[6] = -(cVar8 == -0x80);
    auVar34[7] = -(cVar9 == -0x80);
    auVar34[8] = -(cVar10 == -0x80);
    auVar34[9] = -(cVar11 == -0x80);
    auVar34[10] = -(cVar12 == -0x80);
    auVar34[0xb] = -(cVar13 == -0x80);
    auVar34[0xc] = -(cVar14 == -0x80);
    auVar34[0xd] = -(cVar15 == -0x80);
    auVar34[0xe] = -(cVar16 == -0x80);
    auVar34[0xf] = -(cVar17 == -0x80);
    uVar21 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    if (uVar21 == 0) {
      uVar25 = uVar29 + 0x10;
      if (*(ulong *)this < uVar25) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar26;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, K = std::basic_string_view<char>]"
                     );
      }
      uVar23 = uVar23 + uVar29 + 0x10 & uVar2;
    }
    else {
      cVar20 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar30,*(ctrl_t **)(this + 0x10));
      if (cVar20 == '\0') {
        uVar28 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar28 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar35.offset = uVar28 + uVar23 & uVar2;
      FVar35.probe_length = uVar29;
      lVar31 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar30,FVar35,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar26;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
LAB_002b893a:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
                     );
      }
      pcVar24 = (ctrl_t *)(*(long *)(this + 0x10) + lVar31);
      aVar27.slot_ = (slot_type *)(lVar31 * 0x30 + *(long *)(this + 0x18));
      bVar26 = true;
      uVar25 = uVar29;
    }
    uVar29 = uVar25;
    if (uVar21 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar27;
      __return_storage_ptr__->second = bVar26;
      (__return_storage_ptr__->first).ctrl_ = pcVar24;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }